

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O0

bool pbrt::initArg(string *str,float *ptr)

{
  ulong uVar1;
  float *in_RSI;
  bool bVar2;
  float fVar3;
  invalid_argument *anon_var_0;
  out_of_range *anon_var_0_1;
  size_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  uVar1 = std::__cxx11::string::empty();
  bVar2 = (uVar1 & 1) == 0;
  if (bVar2) {
    fVar3 = std::__cxx11::stof((string *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               in_stack_ffffffffffffffb8);
    *in_RSI = fVar3;
  }
  return bVar2;
}

Assistant:

inline bool initArg(const std::string &str, float *ptr) {
    if (str.empty())
        return false;
    try {
        *ptr = std::stof(str);
    } catch (const std::invalid_argument &) {
        return false;
    } catch (const std::out_of_range &) {
        return false;
    }
    return true;
}